

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int add_pattr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_union value)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  undefined8 in_RCX;
  long lVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  int count_1;
  int size;
  int count;
  int i;
  uint local_24;
  undefined4 local_10;
  
  if (in_EDX == 1) {
    uVar1 = (uint)*(byte *)(*(long *)(in_RDI + 0x10) + 1);
    if (uVar1 != 0) {
      pvVar2 = realloc(*(void **)(in_RDI + 0x10),(long)(int)((uVar1 + 2) * 8 + 0xc));
      *(void **)(in_RDI + 0x10) = pvVar2;
    }
    while ((local_24 = uVar1 - 1, -1 < (int)local_24 &&
           (in_ESI < *(int *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)local_24 * 8)))) {
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)uVar1 * 8) =
           *(undefined4 *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)local_24 * 8);
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 8 + (long)(int)uVar1 * 8) =
           *(undefined4 *)(*(long *)(in_RDI + 0x10) + 8 + (long)(int)local_24 * 8);
      uVar1 = local_24;
    }
    *(int *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)uVar1 * 8) = in_ESI;
    local_10 = (undefined4)in_RCX;
    *(undefined4 *)(*(long *)(in_RDI + 0x10) + 8 + (long)(int)uVar1 * 8) = local_10;
    *(char *)(*(long *)(in_RDI + 0x10) + 1) = *(char *)(*(long *)(in_RDI + 0x10) + 1) + '\x01';
  }
  else {
    uVar1 = (uint)*(byte *)(*(long *)(in_RDI + 0x10) + 2);
    if (uVar1 == 0) {
      pvVar2 = malloc(0x18);
      *(void **)(in_RDI + 8) = pvVar2;
    }
    else {
      pvVar2 = realloc(*(void **)(in_RDI + 8),(long)(int)(uVar1 + 1) * 0x18);
      *(void **)(in_RDI + 8) = pvVar2;
    }
    while ((local_24 = uVar1 - 1, -1 < (int)local_24 &&
           (in_ESI < *(int *)(*(long *)(in_RDI + 8) + (long)(int)local_24 * 0x18)))) {
      *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18) =
           *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_24 * 0x18);
      *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18 + 4) =
           *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_24 * 0x18 + 4);
      lVar3 = *(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18;
      lVar4 = *(long *)(in_RDI + 8) + (long)(int)local_24 * 0x18;
      *(undefined8 *)(lVar3 + 8) = *(undefined8 *)(lVar4 + 8);
      *(undefined8 *)(lVar3 + 0x10) = *(undefined8 *)(lVar4 + 0x10);
      uVar1 = local_24;
    }
    *(int *)(*(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18) = in_ESI;
    *(int *)(*(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18 + 4) = in_EDX;
    lVar3 = *(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18;
    *(undefined8 *)(lVar3 + 8) = in_RCX;
    *(undefined8 *)(lVar3 + 0x10) = in_R8;
    *(char *)(*(long *)(in_RDI + 0x10) + 2) = *(char *)(*(long *)(in_RDI + 0x10) + 2) + '\x01';
  }
  return 1;
}

Assistant:

extern int
add_pattr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_union value)
{
    int i;
    if (val_type == Attr_Int4) {
	int count = list->l.list.iattrs->int_attr_count;
	if (count > 0) {
	    int size = sizeof(struct int_attr_struct) + 
		(count+2)* sizeof(int_attr);
	    list->l.list.iattrs = realloc(list->l.list.iattrs, size);
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.iattrs->iattr[i].attr_id > attr_id) {
		list->l.list.iattrs->iattr[i+1].attr_id = list->l.list.iattrs->iattr[i].attr_id;
		list->l.list.iattrs->iattr[i+1].value = list->l.list.iattrs->iattr[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.iattrs->iattr[i+1].attr_id = attr_id;
	list->l.list.iattrs->iattr[i+1].value = (int4) (long) value.u.i;
	list->l.list.iattrs->int_attr_count++;
    } else {
	int count = list->l.list.iattrs->other_attr_count;
	if (count == 0) {
	    list->l.list.attributes = (attr_p) malloc(sizeof(attr));
	} else {	    
	    list->l.list.attributes = (attr_p) realloc(list->l.list.attributes,
						       sizeof(attr)*(count+1));
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.attributes[i].attr_id > attr_id) {
		list->l.list.attributes[i+1].attr_id = list->l.list.attributes[i].attr_id;
		list->l.list.attributes[i+1].val_type = list->l.list.attributes[i].val_type;
		list->l.list.attributes[i+1].value = list->l.list.attributes[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.attributes[i+1].attr_id = attr_id;
	list->l.list.attributes[i+1].val_type = val_type;
	list->l.list.attributes[i+1].value = value;
	list->l.list.iattrs->other_attr_count++;
    }
    return 1;
}